

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double __thiscall ON_4fPoint::MaximumCoordinate(ON_4fPoint *this)

{
  float fVar1;
  float fVar2;
  
  fVar2 = ABS(this->y);
  if (ABS(this->y) <= ABS(this->x)) {
    fVar2 = ABS(this->x);
  }
  fVar1 = ABS(this->z);
  if (ABS(this->z) <= fVar2) {
    fVar1 = fVar2;
  }
  fVar2 = ABS(this->w);
  if (ABS(this->w) <= fVar1) {
    fVar2 = fVar1;
  }
  return (double)fVar2;
}

Assistant:

double ON_4fPoint::MaximumCoordinate() const
{
  double c = fabs(x); if (fabs(y)>c) c=fabs(y); if (fabs(z)>c) c=fabs(z); if (fabs(w)>c) c=fabs(w);
  return c;
}